

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng::save_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
                       string *filename)

{
  pointer puVar1;
  uint uVar2;
  pointer puVar3;
  ofstream file;
  byte abStack_1f0 [480];
  
  std::ofstream::ofstream(&file,(filename->_M_dataplus)._M_p,_S_out|_S_bin);
  if ((abStack_1f0[*(long *)(_file + -0x18)] & 5) == 0) {
    puVar1 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = 0;
    puVar3 = (pointer)0x0;
    if ((buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      puVar3 = puVar1;
    }
    std::ostream::write((char *)&file,(long)puVar3);
  }
  else {
    uVar2 = 0x4f;
  }
  std::ofstream::~ofstream(&file);
  return uVar2;
}

Assistant:

unsigned save_file(const std::vector<unsigned char>& buffer, const std::string& filename)
{
  std::ofstream file(filename.c_str(), std::ios::out|std::ios::binary);
  if(!file) return 79;
  file.write(buffer.empty() ? 0 : (char*)&buffer[0], std::streamsize(buffer.size()));
  return 0;
}